

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

HullError __thiscall
HullLibrary::CreateConvexHull(HullLibrary *this,HullDesc *desc,HullResult *result)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  cbtVector3 *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  cbtVector3 *pcVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  HullError HVar15;
  uint ovcount;
  PHullResult hr;
  cbtAlignedObjectArray<cbtVector3> vertexScratch;
  cbtAlignedObjectArray<cbtVector3> vertexSource;
  cbtVector3 scale;
  uint local_c4;
  PHullResult local_c0;
  cbtAlignedObjectArray<cbtVector3> local_88;
  cbtAlignedObjectArray<cbtVector3> local_68;
  long local_48;
  cbtVector3 local_40;
  
  local_c0.m_Indices.m_ownsMemory = true;
  local_c0.m_Indices.m_data = (uint *)0x0;
  local_c0.m_Indices.m_size = 0;
  local_c0.m_Indices.m_capacity = 0;
  local_c0.mVcount = 0;
  local_c0.mIndexCount = 0;
  local_c0.mFaceCount = 0;
  local_c0.mVertices = (cbtVector3 *)0x0;
  local_68.m_ownsMemory = true;
  local_68.m_data = (cbtVector3 *)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  uVar11 = 8;
  if (8 < desc->mVcount) {
    uVar11 = desc->mVcount;
  }
  if (-1 < (int)uVar11) {
    pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)uVar11 << 4,0x10);
    if (0 < (long)local_68.m_size) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)(local_68.m_data)->m_floats + lVar12);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar12 = lVar12 + 0x10;
      } while ((long)local_68.m_size * 0x10 != lVar12);
    }
    if ((local_68.m_data != (cbtVector3 *)0x0) && (local_68.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(local_68.m_data);
    }
    local_68._4_8_ = (ulong)uVar11 << 0x20;
    local_68.m_data = pcVar8;
  }
  local_68.m_ownsMemory = true;
  local_68.m_size = uVar11;
  bVar7 = CleanupVertices(this,desc->mVcount,desc->mVertices,desc->mVertexStride,&local_c4,
                          local_68.m_data,desc->mNormalEpsilon,&local_40);
  HVar15 = QE_FAIL;
  if (bVar7) {
    if (local_c4 != 0) {
      uVar11 = 0;
      do {
        local_68.m_data[(int)uVar11].m_floats[0] =
             local_40.m_floats[0] * local_68.m_data[(int)uVar11].m_floats[0];
        local_68.m_data[(int)uVar11].m_floats[1] =
             local_40.m_floats[1] * local_68.m_data[(int)uVar11].m_floats[1];
        local_68.m_data[(int)uVar11].m_floats[2] =
             local_40.m_floats[2] * local_68.m_data[(int)uVar11].m_floats[2];
        uVar11 = uVar11 + 1;
      } while (local_c4 != uVar11);
    }
    bVar7 = ComputeHull(this,local_c4,local_68.m_data,&local_c0,desc->mMaxVertices);
    uVar5 = local_c0._0_8_;
    if (bVar7) {
      local_88.m_ownsMemory = true;
      local_88.m_data = (cbtVector3 *)0x0;
      local_88.m_size = 0;
      local_88.m_capacity = 0;
      uVar11 = local_c0.mVcount;
      if (0 < (long)(int)local_c0.mVcount) {
        pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((long)(int)local_c0.mVcount << 4,0x10);
        if (0 < (long)local_88.m_size) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)((long)(local_88.m_data)->m_floats + lVar12);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar12);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            lVar12 = lVar12 + 0x10;
          } while ((long)local_88.m_size * 0x10 != lVar12);
        }
        if ((local_88.m_data != (cbtVector3 *)0x0) && (local_88.m_ownsMemory == true)) {
          cbtAlignedFreeInternal(local_88.m_data);
        }
        local_88._4_8_ = uVar5 << 0x20;
        local_88.m_data = pcVar8;
      }
      local_88.m_ownsMemory = true;
      local_88.m_size = uVar11;
      BringOutYourDead(this,local_c0.mVertices,local_c0.mVcount,local_88.m_data,&local_c4,
                       local_c0.m_Indices.m_data,local_c0.mIndexCount);
      if ((desc->mFlags & 1) == 0) {
        result->mPolygons = true;
        result->mNumOutputVertices = local_c4;
        if (((result->m_OutputVertices).m_size < (int)local_c4) &&
           ((result->m_OutputVertices).m_capacity < (int)local_c4)) {
          if (local_c4 == 0) {
            pcVar8 = (cbtVector3 *)0x0;
          }
          else {
            pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((long)(int)local_c4 << 4,0x10);
          }
          lVar12 = (long)(result->m_OutputVertices).m_size;
          if (0 < lVar12) {
            lVar13 = 0;
            do {
              puVar1 = (undefined8 *)((long)((result->m_OutputVertices).m_data)->m_floats + lVar13);
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar13);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              lVar13 = lVar13 + 0x10;
            } while (lVar12 * 0x10 != lVar13);
          }
          pcVar4 = (result->m_OutputVertices).m_data;
          if (pcVar4 != (cbtVector3 *)0x0) {
            if ((result->m_OutputVertices).m_ownsMemory == true) {
              cbtAlignedFreeInternal(pcVar4);
            }
            (result->m_OutputVertices).m_data = (cbtVector3 *)0x0;
          }
          (result->m_OutputVertices).m_ownsMemory = true;
          (result->m_OutputVertices).m_data = pcVar8;
          (result->m_OutputVertices).m_capacity = local_c4;
        }
        (result->m_OutputVertices).m_size = local_c4;
        result->mNumFaces = local_c0.mFaceCount;
        uVar11 = local_c0.mFaceCount + local_c0.mIndexCount;
        result->mNumIndices = uVar11;
        iVar3 = (result->m_Indices).m_size;
        if ((iVar3 <= (int)uVar11) && (iVar3 < (int)uVar11)) {
          if ((result->m_Indices).m_capacity < (int)uVar11) {
            if (uVar11 == 0) {
              puVar9 = (uint *)0x0;
            }
            else {
              puVar9 = (uint *)cbtAlignedAllocInternal((long)(int)uVar11 << 2,0x10);
            }
            lVar12 = (long)(result->m_Indices).m_size;
            if (0 < lVar12) {
              puVar10 = (result->m_Indices).m_data;
              lVar13 = 0;
              do {
                puVar9[lVar13] = puVar10[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar12 != lVar13);
            }
            puVar10 = (result->m_Indices).m_data;
            if (puVar10 != (uint *)0x0) {
              if ((result->m_Indices).m_ownsMemory == true) {
                cbtAlignedFreeInternal(puVar10);
              }
              (result->m_Indices).m_data = (uint *)0x0;
            }
            (result->m_Indices).m_ownsMemory = true;
            (result->m_Indices).m_data = puVar9;
            (result->m_Indices).m_capacity = uVar11;
          }
          if (iVar3 < (int)uVar11) {
            memset((result->m_Indices).m_data + iVar3,0,((long)(int)uVar11 - (long)iVar3) * 4);
          }
        }
        (result->m_Indices).m_size = uVar11;
        memcpy((result->m_OutputVertices).m_data,local_88.m_data,(ulong)local_c4 << 4);
        if (local_c0.mFaceCount != 0) {
          puVar10 = (result->m_Indices).m_data + 2;
          uVar11 = 0;
          puVar9 = local_c0.m_Indices.m_data;
          do {
            puVar10[-2] = 3;
            if ((desc->mFlags & 2) == 0) {
              puVar10[-1] = *puVar9;
              *puVar10 = puVar9[1];
              puVar14 = puVar9 + 2;
            }
            else {
              puVar10[-1] = puVar9[2];
              *puVar10 = puVar9[1];
              puVar14 = puVar9;
            }
            puVar10[1] = *puVar14;
            puVar9 = puVar9 + 3;
            uVar11 = uVar11 + 1;
            puVar10 = puVar10 + 4;
          } while (uVar11 < local_c0.mFaceCount);
        }
      }
      else {
        result->mPolygons = false;
        result->mNumOutputVertices = local_c4;
        if (((result->m_OutputVertices).m_size < (int)local_c4) &&
           ((result->m_OutputVertices).m_capacity < (int)local_c4)) {
          if (local_c4 == 0) {
            pcVar8 = (cbtVector3 *)0x0;
          }
          else {
            pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((long)(int)local_c4 << 4,0x10);
          }
          lVar12 = (long)(result->m_OutputVertices).m_size;
          if (0 < lVar12) {
            lVar13 = 0;
            do {
              puVar1 = (undefined8 *)((long)((result->m_OutputVertices).m_data)->m_floats + lVar13);
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar13);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              lVar13 = lVar13 + 0x10;
            } while (lVar12 * 0x10 != lVar13);
          }
          pcVar4 = (result->m_OutputVertices).m_data;
          if (pcVar4 != (cbtVector3 *)0x0) {
            if ((result->m_OutputVertices).m_ownsMemory == true) {
              cbtAlignedFreeInternal(pcVar4);
            }
            (result->m_OutputVertices).m_data = (cbtVector3 *)0x0;
          }
          (result->m_OutputVertices).m_ownsMemory = true;
          (result->m_OutputVertices).m_data = pcVar8;
          (result->m_OutputVertices).m_capacity = local_c4;
        }
        (result->m_OutputVertices).m_size = local_c4;
        result->mNumFaces = local_c0.mFaceCount;
        uVar11 = local_c0.mIndexCount;
        result->mNumIndices = local_c0.mIndexCount;
        iVar3 = (result->m_Indices).m_size;
        if ((iVar3 <= (int)local_c0.mIndexCount) && (iVar3 < (int)local_c0.mIndexCount)) {
          lVar12 = (long)(int)local_c0.mIndexCount;
          if ((result->m_Indices).m_capacity < (int)local_c0.mIndexCount) {
            local_48 = lVar12;
            if (local_c0.mIndexCount == 0) {
              puVar9 = (uint *)0x0;
            }
            else {
              puVar9 = (uint *)cbtAlignedAllocInternal(lVar12 * 4,0x10);
            }
            lVar12 = (long)(result->m_Indices).m_size;
            if (0 < lVar12) {
              puVar10 = (result->m_Indices).m_data;
              lVar13 = 0;
              do {
                puVar9[lVar13] = puVar10[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar12 != lVar13);
            }
            puVar10 = (result->m_Indices).m_data;
            if (puVar10 != (uint *)0x0) {
              if ((result->m_Indices).m_ownsMemory == true) {
                cbtAlignedFreeInternal(puVar10);
              }
              (result->m_Indices).m_data = (uint *)0x0;
            }
            (result->m_Indices).m_ownsMemory = true;
            (result->m_Indices).m_data = puVar9;
            (result->m_Indices).m_capacity = uVar11;
            lVar12 = local_48;
          }
          if (iVar3 < (int)uVar11) {
            memset((result->m_Indices).m_data + iVar3,0,(lVar12 - iVar3) * 4);
          }
        }
        (result->m_Indices).m_size = uVar11;
        memcpy((result->m_OutputVertices).m_data,local_88.m_data,(ulong)local_c4 << 4);
        if ((desc->mFlags & 2) == 0) {
          memcpy((result->m_Indices).m_data,local_c0.m_Indices.m_data,
                 ((ulong)local_c0._0_8_ >> 0x20) << 2);
        }
        else if (local_c0.mFaceCount != 0) {
          puVar9 = (result->m_Indices).m_data;
          lVar12 = 0;
          uVar11 = 0;
          do {
            *(undefined4 *)((long)puVar9 + lVar12) =
                 *(undefined4 *)((long)local_c0.m_Indices.m_data + lVar12 + 8);
            *(undefined4 *)((long)puVar9 + lVar12 + 4) =
                 *(undefined4 *)((long)local_c0.m_Indices.m_data + lVar12 + 4);
            *(undefined4 *)((long)puVar9 + lVar12 + 8) =
                 *(undefined4 *)((long)local_c0.m_Indices.m_data + lVar12);
            uVar11 = uVar11 + 1;
            lVar12 = lVar12 + 0xc;
          } while (uVar11 < local_c0.mFaceCount);
        }
      }
      if (local_c0.m_Indices.m_size != 0) {
        if ((local_c0.m_Indices.m_data != (uint *)0x0) && (local_c0.m_Indices.m_ownsMemory == true))
        {
          cbtAlignedFreeInternal(local_c0.m_Indices.m_data);
        }
        local_c0.m_Indices.m_ownsMemory = true;
        local_c0.m_Indices.m_data = (uint *)0x0;
        local_c0.m_Indices.m_size = 0;
        local_c0.m_Indices.m_capacity = 0;
      }
      HVar15 = QE_OK;
      local_c0.mVcount = 0;
      local_c0.mIndexCount = 0;
      local_c0.mVertices = (cbtVector3 *)0x0;
      cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_88);
    }
  }
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_68);
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_c0.m_Indices);
  return HVar15;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc &desc,  // describes the input request
										HullResult &result)    // contains the resulst
{
	HullError ret = QE_FAIL;

	PHullResult hr;

	unsigned int vcount = desc.mVcount;
	if (vcount < 8) vcount = 8;

	cbtAlignedObjectArray<cbtVector3> vertexSource;
	vertexSource.resize(static_cast<int>(vcount));

	cbtVector3 scale;

	unsigned int ovcount;

	bool ok = CleanupVertices(desc.mVcount, desc.mVertices, desc.mVertexStride, ovcount, &vertexSource[0], desc.mNormalEpsilon, scale);  // normalize point cloud, remove duplicates!

	if (ok)
	{
		//		if ( 1 ) // scale vertices back to their original size.
		{
			for (unsigned int i = 0; i < ovcount; i++)
			{
				cbtVector3 &v = vertexSource[static_cast<int>(i)];
				v[0] *= scale[0];
				v[1] *= scale[1];
				v[2] *= scale[2];
			}
		}

		ok = ComputeHull(ovcount, &vertexSource[0], hr, desc.mMaxVertices);

		if (ok)
		{
			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			cbtAlignedObjectArray<cbtVector3> vertexScratch;
			vertexScratch.resize(static_cast<int>(hr.mVcount));

			BringOutYourDead(hr.mVertices, hr.mVcount, &vertexScratch[0], ovcount, &hr.m_Indices[0], hr.mIndexCount);

			ret = QE_OK;

			if (desc.HasHullFlag(QF_TRIANGLES))  // if he wants the results as triangle!
			{
				result.mPolygons = false;
				result.mNumOutputVertices = ovcount;
				result.m_OutputVertices.resize(static_cast<int>(ovcount));
				result.mNumFaces = hr.mFaceCount;
				result.mNumIndices = hr.mIndexCount;

				result.m_Indices.resize(static_cast<int>(hr.mIndexCount));

				memcpy(&result.m_OutputVertices[0], &vertexScratch[0], sizeof(cbtVector3) * ovcount);

				if (desc.HasHullFlag(QF_REVERSE_ORDER))
				{
					const unsigned int *source = &hr.m_Indices[0];
					unsigned int *dest = &result.m_Indices[0];

					for (unsigned int i = 0; i < hr.mFaceCount; i++)
					{
						dest[0] = source[2];
						dest[1] = source[1];
						dest[2] = source[0];
						dest += 3;
						source += 3;
					}
				}
				else
				{
					memcpy(&result.m_Indices[0], &hr.m_Indices[0], sizeof(unsigned int) * hr.mIndexCount);
				}
			}
			else
			{
				result.mPolygons = true;
				result.mNumOutputVertices = ovcount;
				result.m_OutputVertices.resize(static_cast<int>(ovcount));
				result.mNumFaces = hr.mFaceCount;
				result.mNumIndices = hr.mIndexCount + hr.mFaceCount;
				result.m_Indices.resize(static_cast<int>(result.mNumIndices));
				memcpy(&result.m_OutputVertices[0], &vertexScratch[0], sizeof(cbtVector3) * ovcount);

				//				if ( 1 )
				{
					const unsigned int *source = &hr.m_Indices[0];
					unsigned int *dest = &result.m_Indices[0];
					for (unsigned int i = 0; i < hr.mFaceCount; i++)
					{
						dest[0] = 3;
						if (desc.HasHullFlag(QF_REVERSE_ORDER))
						{
							dest[1] = source[2];
							dest[2] = source[1];
							dest[3] = source[0];
						}
						else
						{
							dest[1] = source[0];
							dest[2] = source[1];
							dest[3] = source[2];
						}

						dest += 4;
						source += 3;
					}
				}
			}
			ReleaseHull(hr);
		}
	}

	return ret;
}